

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animstate.cpp
# Opt level: O0

CAnimState * CAnimState::GetIdle(void)

{
  float unaff_retaddr;
  float in_stack_00000008;
  float in_stack_0000000c;
  CAnimation *in_stack_00000010;
  CAnimState *in_stack_00000018;
  
  if (GetIdle::Init) {
    Set((CAnimState *)in_stack_00000010,(CAnimation *)CONCAT44(in_stack_0000000c,in_stack_00000008),
        unaff_retaddr);
    Add(in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008);
    GetIdle::Init = false;
  }
  return &GetIdle::State;
}

Assistant:

CAnimState *CAnimState::GetIdle()
{
	static CAnimState State;
	static bool Init = true;

	if(Init)
	{
		State.Set(&g_pData->m_aAnimations[ANIM_BASE], 0);
		State.Add(&g_pData->m_aAnimations[ANIM_IDLE], 0, 1.0f);
		Init = false;
	}

	return &State;
}